

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

void __thiscall slang::analysis::ClockVisitor::checkGFSVC(ClockVisitor *this)

{
  SourceRange sourceRange;
  long in_RDI;
  Diagnostic *unaff_retaddr;
  string_view in_stack_00000008;
  Diagnostic *diag;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  
  if ((((*(byte *)(in_RDI + 0x6a) & 1) == 0) && (*(long *)(in_RDI + 0x60) != 0)) &&
     ((*(byte *)(in_RDI + 0x69) & 1) != 0)) {
    *(undefined1 *)(in_RDI + 0x6a) = 1;
    sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffe8;
    sourceRange.startLoc = (SourceLocation)*(undefined8 *)(*(long *)(in_RDI + 0x60) + 0x28);
    sourceRange.endLoc._4_4_ = 0x2000e;
    AnalysisContext::addDiag
              (*(AnalysisContext **)(*(long *)(in_RDI + 0x60) + 0x20),(Symbol *)local_38,
               SUB84((ulong)in_stack_fffffffffffffff0 >> 0x20,0),sourceRange);
    slang::ast::CallExpression::getSubroutineName(local_38);
    Diagnostic::operator<<(unaff_retaddr,in_stack_00000008);
  }
  return;
}

Assistant:

void checkGFSVC() {
        if (!bad && globalFutureSampledValueCall && hasMatchItems) {
            bad = true;

            auto& diag = context.addDiag(parentSymbol, diag::GFSVMatchItems,
                                         globalFutureSampledValueCall->sourceRange);
            diag << globalFutureSampledValueCall->getSubroutineName();
        }
    }